

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O2

void __thiscall xe::TestResultParser::handleElementStart(TestResultParser *this)

{
  List *this_00;
  pointer ppIVar1;
  bool bVar2;
  deBool dVar3;
  TestLogVersion TVar4;
  TestCaseType TVar5;
  Type TVar6;
  TestStatusCode TVar7;
  int iVar8;
  char *pcVar9;
  EglConfig *item;
  TestResultParseError *pTVar10;
  Type TVar11;
  string *psVar12;
  Item *pIVar13;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pcVar9 = (this->m_xmlParser).m_elementName._M_dataplus._M_p;
  if (this->m_state == STATE_INITIALIZED) {
    dVar3 = deStringEqual(pcVar9,"TestCaseResult");
    if (dVar3 == 0) {
      pTVar10 = (TestResultParseError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"Expected <TestCaseResult>, got <",&local_89);
      std::operator+(&local_68,&local_48,pcVar9);
      std::operator+(&local_88,&local_68,">");
      TestResultParseError::TestResultParseError(pTVar10,&local_88);
      __cxa_throw(pTVar10,&TestResultParseError::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar9 = getAttribute(this,"Version");
    TVar4 = getEnumValue("test log version",(EnumMapEntry *)s_logVersionMap,6,pcVar9);
    this->m_logVersion = TVar4;
    getAttribute(this,"CasePath");
    std::__cxx11::string::assign((char *)this->m_result);
    (this->m_result->super_TestCaseResultHeader).caseType = TESTCASETYPE_SELF_VALIDATE;
    bVar2 = xml::Parser::hasAttribute(&this->m_xmlParser,"CaseType");
    if (bVar2) {
      pcVar9 = xml::Parser::getAttribute(&this->m_xmlParser,"CaseType");
      TVar5 = getEnumValue("test case type",(EnumMapEntry *)s_testTypeMap,4,pcVar9);
    }
    else {
      if (2 < (int)this->m_logVersion) {
        pTVar10 = (TestResultParseError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,"Missing CaseType attribute in <TestCaseResult>",
                   (allocator<char> *)&local_68);
        TestResultParseError::TestResultParseError(pTVar10,&local_88);
        __cxa_throw(pTVar10,&TestResultParseError::typeinfo,std::runtime_error::~runtime_error);
      }
      pcVar9 = (this->m_result->super_TestCaseResultHeader).casePath._M_dataplus._M_p;
      dVar3 = deStringBeginsWith(pcVar9,"dEQP-GLES2.");
      if (dVar3 == 0) {
        TVar5 = TESTCASETYPE_SELF_VALIDATE;
      }
      else {
        pcVar9 = pcVar9 + 0xb;
        dVar3 = deStringBeginsWith(pcVar9,"capability.");
        if (dVar3 == 0) {
          dVar3 = deStringBeginsWith(pcVar9,"accuracy.");
          if (dVar3 == 0) {
            dVar3 = deStringBeginsWith(pcVar9,"performance.");
            TVar5 = (uint)(dVar3 != 0) * 3;
          }
          else {
            TVar5 = TESTCASETYPE_ACCURACY;
          }
        }
        else {
          TVar5 = TESTCASETYPE_CAPABILITY;
        }
      }
    }
    (this->m_result->super_TestCaseResultHeader).caseType = TVar5;
    this->m_state = STATE_IN_TEST_CASE_RESULT;
    return;
  }
  this_00 = this->m_curItemList;
  TVar6 = getResultItemType(pcVar9);
  ppIVar1 = (this->m_itemStack).super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  TVar11 = TYPE_LAST;
  if (((this->m_itemStack).super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>.
       _M_impl.super__Vector_impl_data._M_start == ppIVar1) ||
     (pIVar13 = ppIVar1[-1], pIVar13 == (Item *)0x0)) {
    pIVar13 = (Item *)0x0;
  }
  else {
    TVar11 = pIVar13->m_type;
  }
  switch(TVar6) {
  case TYPE_RESULT:
    item = (EglConfig *)ri::List::allocItem<xe::ri::Result>(this_00);
    pcVar9 = getAttribute(this,"StatusCode");
    TVar7 = getTestStatusCode(pcVar9);
    *(TestStatusCode *)&(item->super_Item).field_0xc = TVar7;
    break;
  case TYPE_TEXT:
    item = (EglConfig *)ri::List::allocItem<xe::ri::Text>(this_00);
    break;
  case TYPE_NUMBER:
    item = (EglConfig *)ri::List::allocItem<xe::ri::Number>(this_00);
    getAttribute(this,"Name");
    std::__cxx11::string::assign((char *)&item->redSize);
    getAttribute(this,"Description");
    std::__cxx11::string::assign((char *)&item->colorBufferType);
    getAttribute(this,"Unit");
    std::__cxx11::string::assign((char *)&item->configCaveat);
    bVar2 = xml::Parser::hasAttribute(&this->m_xmlParser,"Tag");
    if (bVar2) {
      xml::Parser::getAttribute(&this->m_xmlParser,"Tag");
      std::__cxx11::string::assign((char *)&item->configID);
    }
    (this->m_curNumValue)._M_string_length = 0;
    *(this->m_curNumValue)._M_dataplus._M_p = '\0';
    break;
  case TYPE_IMAGE:
    item = (EglConfig *)ri::List::allocItem<xe::ri::Image>(this_00);
    getAttribute(this,"Name");
    std::__cxx11::string::assign((char *)&item->redSize);
    getAttribute(this,"Description");
    std::__cxx11::string::assign((char *)&item->colorBufferType);
    pcVar9 = getAttribute(this,"Width");
    iVar8 = atoi(pcVar9);
    *(int *)&(item->configCaveat)._M_dataplus._M_p = iVar8;
    pcVar9 = getAttribute(this,"Height");
    iVar8 = atoi(pcVar9);
    *(int *)((long)&(item->configCaveat)._M_dataplus._M_p + 4) = iVar8;
    pcVar9 = getAttribute(this,"Format");
    iVar8 = getEnumValue("image format",(EnumMapEntry *)s_imageFormatMap,2,pcVar9);
    *(int *)&(((InfoLog *)&(item->configCaveat)._M_string_length)->super_Item)._vptr_Item = iVar8;
    pcVar9 = getAttribute(this,"CompressionMode");
    iVar8 = getEnumValue("image compression",(EnumMapEntry *)s_compressionMap,2,pcVar9);
    *(int *)((long)&(((InfoLog *)&(item->configCaveat)._M_string_length)->super_Item)._vptr_Item + 4
            ) = iVar8;
    break;
  case TYPE_IMAGESET:
    item = (EglConfig *)ri::List::allocItem<xe::ri::ImageSet>(this_00);
    goto LAB_00121bf4;
  case TYPE_SHADER:
    if (TVar11 != TYPE_SHADERPROGRAM) {
      pTVar10 = (TestResultParseError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"<",&local_89);
      std::operator+(&local_68,&local_48,pcVar9);
      std::operator+(&local_88,&local_68,"> outside of <ShaderProgram>");
      TestResultParseError::TestResultParseError(pTVar10,&local_88);
      __cxa_throw(pTVar10,&TestResultParseError::typeinfo,std::runtime_error::~runtime_error);
    }
    item = (EglConfig *)ri::List::allocItem<xe::ri::Shader>(this_00);
    iVar8 = getEnumValue("shader type",(EnumMapEntry *)s_shaderTypeFromTagMap,6,pcVar9);
    *(int *)&(item->super_Item).field_0xc = iVar8;
    pcVar9 = getAttribute(this,"CompileStatus");
    bVar2 = toBool(pcVar9);
    *(bool *)&(((string *)&item->redSize)->_M_dataplus)._M_p = bVar2;
    break;
  case TYPE_SHADERPROGRAM:
    item = (EglConfig *)ri::List::allocItem<xe::ri::ShaderProgram>(this_00);
    pcVar9 = getAttribute(this,"LinkStatus");
    bVar2 = toBool(pcVar9);
    item->bindToTextureRGB = bVar2;
    break;
  case TYPE_SHADERSOURCE:
    if (TVar11 != TYPE_SHADER) {
      pTVar10 = (TestResultParseError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"Unexpected <ShaderSource>",(allocator<char> *)&local_68);
      TestResultParseError::TestResultParseError(pTVar10,&local_88);
      __cxa_throw(pTVar10,&TestResultParseError::typeinfo,std::runtime_error::~runtime_error);
    }
    item = (EglConfig *)&pIVar13[1].m_type;
    break;
  case TYPE_SPIRVSOURCE:
    if (TVar11 != TYPE_SHADERPROGRAM) {
      pTVar10 = (TestResultParseError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"<",&local_89);
      std::operator+(&local_68,&local_48,pcVar9);
      std::operator+(&local_88,&local_68,"> outside of <ShaderProgram>");
      TestResultParseError::TestResultParseError(pTVar10,&local_88);
      __cxa_throw(pTVar10,&TestResultParseError::typeinfo,std::runtime_error::~runtime_error);
    }
    item = (EglConfig *)ri::List::allocItem<xe::ri::SpirVSource>(this_00);
    break;
  case TYPE_INFOLOG:
    if (TVar11 == TYPE_SHADER) {
      item = (EglConfig *)&pIVar13[4].m_type;
    }
    else if (TVar11 == TYPE_COMPILEINFO) {
      item = (EglConfig *)&pIVar13[5].m_type;
    }
    else {
      if (TVar11 != TYPE_SHADERPROGRAM) {
        pTVar10 = (TestResultParseError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,"Unexpected <InfoLog>",(allocator<char> *)&local_68);
        TestResultParseError::TestResultParseError(pTVar10,&local_88);
        __cxa_throw(pTVar10,&TestResultParseError::typeinfo,std::runtime_error::~runtime_error);
      }
      item = (EglConfig *)(pIVar13 + 3);
    }
    break;
  case TYPE_EGLCONFIG:
    item = ri::List::allocItem<xe::ri::EglConfig>(this_00);
    pcVar9 = getAttribute(this,"BufferSize");
    iVar8 = atoi(pcVar9);
    *(int *)&(item->super_Item).field_0xc = iVar8;
    pcVar9 = getAttribute(this,"RedSize");
    iVar8 = atoi(pcVar9);
    item->redSize = iVar8;
    pcVar9 = getAttribute(this,"GreenSize");
    iVar8 = atoi(pcVar9);
    item->greenSize = iVar8;
    pcVar9 = getAttribute(this,"BlueSize");
    iVar8 = atoi(pcVar9);
    item->blueSize = iVar8;
    pcVar9 = getAttribute(this,"LuminanceSize");
    iVar8 = atoi(pcVar9);
    item->luminanceSize = iVar8;
    pcVar9 = getAttribute(this,"AlphaSize");
    iVar8 = atoi(pcVar9);
    item->alphaSize = iVar8;
    pcVar9 = getAttribute(this,"AlphaMaskSize");
    iVar8 = atoi(pcVar9);
    item->alphaMaskSize = iVar8;
    pcVar9 = getAttribute(this,"BindToTextureRGB");
    bVar2 = toBool(pcVar9);
    item->bindToTextureRGB = bVar2;
    pcVar9 = getAttribute(this,"BindToTextureRGBA");
    bVar2 = toBool(pcVar9);
    item->bindToTextureRGBA = bVar2;
    getAttribute(this,"ColorBufferType");
    std::__cxx11::string::assign((char *)&item->colorBufferType);
    getAttribute(this,"ConfigCaveat");
    std::__cxx11::string::assign((char *)&item->configCaveat);
    pcVar9 = getAttribute(this,"ConfigID");
    iVar8 = atoi(pcVar9);
    item->configID = iVar8;
    getAttribute(this,"Conformant");
    std::__cxx11::string::assign((char *)&item->conformant);
    pcVar9 = getAttribute(this,"DepthSize");
    iVar8 = atoi(pcVar9);
    item->depthSize = iVar8;
    pcVar9 = getAttribute(this,"Level");
    iVar8 = atoi(pcVar9);
    item->level = iVar8;
    pcVar9 = getAttribute(this,"MaxPBufferWidth");
    iVar8 = atoi(pcVar9);
    item->maxPBufferWidth = iVar8;
    pcVar9 = getAttribute(this,"MaxPBufferHeight");
    iVar8 = atoi(pcVar9);
    item->maxPBufferHeight = iVar8;
    pcVar9 = getAttribute(this,"MaxPBufferPixels");
    iVar8 = atoi(pcVar9);
    item->maxPBufferPixels = iVar8;
    pcVar9 = getAttribute(this,"MaxSwapInterval");
    iVar8 = atoi(pcVar9);
    item->maxSwapInterval = iVar8;
    pcVar9 = getAttribute(this,"MinSwapInterval");
    iVar8 = atoi(pcVar9);
    item->minSwapInterval = iVar8;
    pcVar9 = getAttribute(this,"NativeRenderable");
    bVar2 = toBool(pcVar9);
    item->nativeRenderable = bVar2;
    getAttribute(this,"RenderableType");
    std::__cxx11::string::assign((char *)&item->renderableType);
    pcVar9 = getAttribute(this,"SampleBuffers");
    iVar8 = atoi(pcVar9);
    item->sampleBuffers = iVar8;
    pcVar9 = getAttribute(this,"Samples");
    iVar8 = atoi(pcVar9);
    item->samples = iVar8;
    pcVar9 = getAttribute(this,"StencilSize");
    iVar8 = atoi(pcVar9);
    item->stencilSize = iVar8;
    getAttribute(this,"SurfaceTypes");
    std::__cxx11::string::assign((char *)&item->surfaceTypes);
    getAttribute(this,"TransparentType");
    std::__cxx11::string::assign((char *)&item->transparentType);
    pcVar9 = getAttribute(this,"TransparentRedValue");
    iVar8 = atoi(pcVar9);
    item->transparentRedValue = iVar8;
    pcVar9 = getAttribute(this,"TransparentGreenValue");
    iVar8 = atoi(pcVar9);
    item->transparentGreenValue = iVar8;
    pcVar9 = getAttribute(this,"TransparentBlueValue");
    iVar8 = atoi(pcVar9);
    item->transparentBlueValue = iVar8;
    break;
  case TYPE_EGLCONFIGSET:
    item = (EglConfig *)ri::List::allocItem<xe::ri::EglConfigSet>(this_00);
    getAttribute(this,"Name");
    std::__cxx11::string::assign((char *)&item->redSize);
    bVar2 = xml::Parser::hasAttribute(&this->m_xmlParser,"Description");
    if (bVar2) {
      xml::Parser::getAttribute(&this->m_xmlParser,"Description");
    }
    psVar12 = &item->colorBufferType;
    goto LAB_00122236;
  case TYPE_SECTION:
    item = (EglConfig *)ri::List::allocItem<xe::ri::Section>(this_00);
    goto LAB_00121bf4;
  case TYPE_KERNELSOURCE:
    item = (EglConfig *)ri::List::allocItem<xe::ri::KernelSource>(this_00);
    break;
  case TYPE_COMPILEINFO:
    item = (EglConfig *)ri::List::allocItem<xe::ri::CompileInfo>(this_00);
    getAttribute(this,"Name");
    std::__cxx11::string::assign((char *)&item->redSize);
    getAttribute(this,"Description");
    std::__cxx11::string::assign((char *)&item->colorBufferType);
    pcVar9 = getAttribute(this,"CompileStatus");
    bVar2 = toBool(pcVar9);
    *(bool *)&(item->configCaveat)._M_dataplus._M_p = bVar2;
    break;
  case TYPE_SAMPLELIST:
    item = (EglConfig *)ri::List::allocItem<xe::ri::SampleList>(this_00);
LAB_00121bf4:
    getAttribute(this,"Name");
    std::__cxx11::string::assign((char *)&item->redSize);
    getAttribute(this,"Description");
    psVar12 = &item->colorBufferType;
LAB_00122236:
    std::__cxx11::string::assign((char *)psVar12);
    break;
  case TYPE_SAMPLEINFO:
    if (TVar11 != TYPE_SAMPLELIST) {
      pTVar10 = (TestResultParseError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"<SampleInfo> outside of <SampleList>",
                 (allocator<char> *)&local_68);
      TestResultParseError::TestResultParseError(pTVar10,&local_88);
      __cxa_throw(pTVar10,&TestResultParseError::typeinfo,std::runtime_error::~runtime_error);
    }
    item = (EglConfig *)(pIVar13 + 5);
    break;
  case TYPE_VALUEINFO:
    if (TVar11 != TYPE_SAMPLEINFO) {
      pTVar10 = (TestResultParseError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"<ValueInfo> outside of <SampleInfo>",
                 (allocator<char> *)&local_68);
      TestResultParseError::TestResultParseError(pTVar10,&local_88);
      __cxa_throw(pTVar10,&TestResultParseError::typeinfo,std::runtime_error::~runtime_error);
    }
    item = (EglConfig *)ri::List::allocItem<xe::ri::ValueInfo>((List *)(pIVar13 + 1));
    getAttribute(this,"Name");
    std::__cxx11::string::assign((char *)&item->redSize);
    getAttribute(this,"Description");
    std::__cxx11::string::assign((char *)&item->colorBufferType);
    pcVar9 = getAttribute(this,"Tag");
    iVar8 = getEnumValue("sample value tag",(EnumMapEntry *)s_sampleValueTagMap,2,pcVar9);
    *(int *)&(((string *)&item->configID)->_M_dataplus)._M_p = iVar8;
    bVar2 = xml::Parser::hasAttribute(&this->m_xmlParser,"Unit");
    if (!bVar2) break;
    getAttribute(this,"Unit");
    psVar12 = &item->configCaveat;
    goto LAB_00122236;
  case TYPE_SAMPLE:
    if (TVar11 != TYPE_SAMPLELIST) {
      pTVar10 = (TestResultParseError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"<Sample> outside of <SampleList>",(allocator<char> *)&local_68
                );
      TestResultParseError::TestResultParseError(pTVar10,&local_88);
      __cxa_throw(pTVar10,&TestResultParseError::typeinfo,std::runtime_error::~runtime_error);
    }
    item = (EglConfig *)ri::List::allocItem<xe::ri::Sample>((List *)&pIVar13[7].m_type);
    break;
  case TYPE_SAMPLEVALUE:
    if (TVar11 != TYPE_SAMPLE) {
      pTVar10 = (TestResultParseError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"<Value> outside of <Sample>",(allocator<char> *)&local_68);
      TestResultParseError::TestResultParseError(pTVar10,&local_88);
      __cxa_throw(pTVar10,&TestResultParseError::typeinfo,std::runtime_error::~runtime_error);
    }
    item = (EglConfig *)ri::List::allocItem<xe::ri::SampleValue>((List *)(pIVar13 + 1));
    break;
  default:
    pTVar10 = (TestResultParseError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Unsupported element \'",&local_89);
    std::operator+(&local_68,&local_48,pcVar9);
    std::operator+(&local_88,&local_68,"\'");
    TestResultParseError::TestResultParseError(pTVar10,&local_88);
    __cxa_throw(pTVar10,&TestResultParseError::typeinfo,std::runtime_error::~runtime_error);
  }
  pushItem(this,&item->super_Item);
  this->m_base64DecodeOffset = 0;
  return;
}

Assistant:

void TestResultParser::handleElementStart (void)
{
	const char* elemName = m_xmlParser.getElementName();

	if (m_state == STATE_INITIALIZED)
	{
		// Expect TestCaseResult.
		if (!deStringEqual(elemName, "TestCaseResult"))
			throw TestResultParseError(string("Expected <TestCaseResult>, got <") + elemName + ">");

		const char* version = getAttribute("Version");
		m_logVersion = getTestLogVersion(version);
		// \note Currently assumed that all known log versions are supported.

		m_result->casePath	= getAttribute("CasePath");
		m_result->caseType	= TESTCASETYPE_SELF_VALIDATE;

		if (m_xmlParser.hasAttribute("CaseType"))
			m_result->caseType = getTestCaseType(m_xmlParser.getAttribute("CaseType"));
		else
		{
			// Do guess based on path for legacy log files.
			if (m_logVersion >= TESTLOGVERSION_0_3_2)
				throw TestResultParseError("Missing CaseType attribute in <TestCaseResult>");
			m_result->caseType = getTestCaseTypeFromPath(m_result->casePath.c_str());
		}

		m_state = STATE_IN_TEST_CASE_RESULT;
	}
	else
	{
		ri::List*	curList		= getCurrentItemList();
		ri::Type	itemType	= getResultItemType(elemName);
		ri::Item*	item		= DE_NULL;
		ri::Item*	parentItem	= getCurrentItem();
		ri::Type	parentType	= parentItem ? parentItem->getType() : ri::TYPE_LAST;

		switch (itemType)
		{
			case ri::TYPE_RESULT:
			{
				ri::Result* result = curList->allocItem<ri::Result>();
				result->statusCode = getTestStatusCode(getAttribute("StatusCode"));
				item = result;
				break;
			}

			case ri::TYPE_TEXT:
				item = curList->allocItem<ri::Text>();
				break;

			case ri::TYPE_SECTION:
			{
				ri::Section* section = curList->allocItem<ri::Section>();
				section->name			= getAttribute("Name");
				section->description	= getAttribute("Description");
				item = section;
				break;
			}

			case ri::TYPE_NUMBER:
			{
				ri::Number* number = curList->allocItem<ri::Number>();
				number->name		= getAttribute("Name");
				number->description	= getAttribute("Description");
				number->unit		= getAttribute("Unit");

				if (m_xmlParser.hasAttribute("Tag"))
					number->tag = m_xmlParser.getAttribute("Tag");

				item = number;

				m_curNumValue.clear();
				break;
			}

			case ri::TYPE_IMAGESET:
			{
				ri::ImageSet* imageSet = curList->allocItem<ri::ImageSet>();
				imageSet->name			= getAttribute("Name");
				imageSet->description	= getAttribute("Description");
				item = imageSet;
				break;
			}

			case ri::TYPE_IMAGE:
			{
				ri::Image* image = curList->allocItem<ri::Image>();
				image->name			= getAttribute("Name");
				image->description	= getAttribute("Description");
				image->width		= toInt(getAttribute("Width"));
				image->height		= toInt(getAttribute("Height"));
				image->format		= getImageFormat(getAttribute("Format"));
				image->compression	= getImageCompression(getAttribute("CompressionMode"));
				item = image;
				break;
			}

			case ri::TYPE_SHADERPROGRAM:
			{
				ri::ShaderProgram* shaderProgram = curList->allocItem<ri::ShaderProgram>();
				shaderProgram->linkStatus = toBool(getAttribute("LinkStatus"));
				item = shaderProgram;
				break;
			}

			case ri::TYPE_SHADER:
			{
				if (parentType != ri::TYPE_SHADERPROGRAM)
					throw TestResultParseError(string("<") + elemName + "> outside of <ShaderProgram>");

				ri::Shader* shader = curList->allocItem<ri::Shader>();

				shader->shaderType		= getShaderTypeFromTagName(elemName);
				shader->compileStatus	= toBool(getAttribute("CompileStatus"));

				item = shader;
				break;
			}

			case ri::TYPE_SPIRVSOURCE:
			{
				if (parentType != ri::TYPE_SHADERPROGRAM)
					throw TestResultParseError(string("<") + elemName + "> outside of <ShaderProgram>");
				item = curList->allocItem<ri::SpirVSource>();
				break;
			}

			case ri::TYPE_SHADERSOURCE:
				if (parentType == ri::TYPE_SHADER)
					item = &static_cast<ri::Shader*>(parentItem)->source;
				else
					throw TestResultParseError("Unexpected <ShaderSource>");
				break;

			case ri::TYPE_INFOLOG:
				if (parentType == ri::TYPE_SHADERPROGRAM)
					item = &static_cast<ri::ShaderProgram*>(parentItem)->linkInfoLog;
				else if (parentType == ri::TYPE_SHADER)
					item = &static_cast<ri::Shader*>(parentItem)->infoLog;
				else if (parentType == ri::TYPE_COMPILEINFO)
					item = &static_cast<ri::CompileInfo*>(parentItem)->infoLog;
				else
					throw TestResultParseError("Unexpected <InfoLog>");
				break;

			case ri::TYPE_KERNELSOURCE:
				item = curList->allocItem<ri::KernelSource>();
				break;

			case ri::TYPE_COMPILEINFO:
			{
				ri::CompileInfo* info = curList->allocItem<ri::CompileInfo>();
				info->name			= getAttribute("Name");
				info->description	= getAttribute("Description");
				info->compileStatus	= toBool(getAttribute("CompileStatus"));
				item = info;
				break;
			}

			case ri::TYPE_EGLCONFIGSET:
			{
				ri::EglConfigSet* set = curList->allocItem<ri::EglConfigSet>();
				set->name			= getAttribute("Name");
				set->description	= m_xmlParser.hasAttribute("Description") ? m_xmlParser.getAttribute("Description") : "";
				item = set;
				break;
			}

			case ri::TYPE_EGLCONFIG:
			{
				ri::EglConfig* config = curList->allocItem<ri::EglConfig>();
				config->bufferSize				= toInt(getAttribute("BufferSize"));
				config->redSize					= toInt(getAttribute("RedSize"));
				config->greenSize				= toInt(getAttribute("GreenSize"));
				config->blueSize				= toInt(getAttribute("BlueSize"));
				config->luminanceSize			= toInt(getAttribute("LuminanceSize"));
				config->alphaSize				= toInt(getAttribute("AlphaSize"));
				config->alphaMaskSize			= toInt(getAttribute("AlphaMaskSize"));
				config->bindToTextureRGB		= toBool(getAttribute("BindToTextureRGB"));
				config->bindToTextureRGBA		= toBool(getAttribute("BindToTextureRGBA"));
				config->colorBufferType			= getAttribute("ColorBufferType");
				config->configCaveat			= getAttribute("ConfigCaveat");
				config->configID				= toInt(getAttribute("ConfigID"));
				config->conformant				= getAttribute("Conformant");
				config->depthSize				= toInt(getAttribute("DepthSize"));
				config->level					= toInt(getAttribute("Level"));
				config->maxPBufferWidth			= toInt(getAttribute("MaxPBufferWidth"));
				config->maxPBufferHeight		= toInt(getAttribute("MaxPBufferHeight"));
				config->maxPBufferPixels		= toInt(getAttribute("MaxPBufferPixels"));
				config->maxSwapInterval			= toInt(getAttribute("MaxSwapInterval"));
				config->minSwapInterval			= toInt(getAttribute("MinSwapInterval"));
				config->nativeRenderable		= toBool(getAttribute("NativeRenderable"));
				config->renderableType			= getAttribute("RenderableType");
				config->sampleBuffers			= toInt(getAttribute("SampleBuffers"));
				config->samples					= toInt(getAttribute("Samples"));
				config->stencilSize				= toInt(getAttribute("StencilSize"));
				config->surfaceTypes			= getAttribute("SurfaceTypes");
				config->transparentType			= getAttribute("TransparentType");
				config->transparentRedValue		= toInt(getAttribute("TransparentRedValue"));
				config->transparentGreenValue	= toInt(getAttribute("TransparentGreenValue"));
				config->transparentBlueValue	= toInt(getAttribute("TransparentBlueValue"));
				item = config;
				break;
			}

			case ri::TYPE_SAMPLELIST:
			{
				ri::SampleList* list = curList->allocItem<ri::SampleList>();
				list->name			= getAttribute("Name");
				list->description	= getAttribute("Description");
				item = list;
				break;
			}

			case ri::TYPE_SAMPLEINFO:
			{
				if (parentType != ri::TYPE_SAMPLELIST)
					throw TestResultParseError("<SampleInfo> outside of <SampleList>");

				ri::SampleList*	list	= static_cast<ri::SampleList*>(parentItem);
				ri::SampleInfo*	info	= &list->sampleInfo;

				item = info;
				break;
			}

			case ri::TYPE_VALUEINFO:
			{
				if (parentType != ri::TYPE_SAMPLEINFO)
					throw TestResultParseError("<ValueInfo> outside of <SampleInfo>");

				ri::SampleInfo*	sampleInfo	= static_cast<ri::SampleInfo*>(parentItem);
				ri::ValueInfo*	valueInfo	= sampleInfo->valueInfos.allocItem<ri::ValueInfo>();

				valueInfo->name			= getAttribute("Name");
				valueInfo->description	= getAttribute("Description");
				valueInfo->tag			= getSampleValueTag(getAttribute("Tag"));

				if (m_xmlParser.hasAttribute("Unit"))
					valueInfo->unit = getAttribute("Unit");

				item = valueInfo;
				break;
			}

			case ri::TYPE_SAMPLE:
			{
				if (parentType != ri::TYPE_SAMPLELIST)
					throw TestResultParseError("<Sample> outside of <SampleList>");

				ri::SampleList*	list	= static_cast<ri::SampleList*>(parentItem);
				ri::Sample*		sample	= list->samples.allocItem<ri::Sample>();

				item = sample;
				break;
			}

			case ri::TYPE_SAMPLEVALUE:
			{
				if (parentType != ri::TYPE_SAMPLE)
					throw TestResultParseError("<Value> outside of <Sample>");

				ri::Sample*			sample	= static_cast<ri::Sample*>(parentItem);
				ri::SampleValue*	value	= sample->values.allocItem<ri::SampleValue>();

				item = value;
				break;
			}

			default:
				throw TestResultParseError(string("Unsupported element '") + elemName + ("'"));
		}

		DE_ASSERT(item);
		pushItem(item);

		// Reset base64 decoding offset.
		m_base64DecodeOffset = 0;
	}
}